

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputFile1.unit.cpp
# Opt level: O0

void __thiscall TestFile1::SetUp(TestFile1 *this)

{
  ostream local_248 [8];
  ofstream out;
  allocator<char> local_31;
  string local_30 [8];
  string inputContent;
  TestFile1 *this_local;
  
  inputContent.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "{ Units, Wavelength Units } SI Microns\n{ Thickness } 3.048 \n{ Conductivity } 1\n{ IR Transmittance } TIR=0\n{ Emissivity, front back } Emis= 0.84 0.84\n{ }\n{ Ef_Source: Material }\n{ Eb_Source: Material }\n{ IGDB_Checksum: -1717699038 }\n{ Product Name: Generic Clear Glass }\n{ Manufacturer: Generic }\n{ NFRC ID: 102 }\n{ Type: Monolithic }\n{ Material: Glass }\n{ Coating Name: N/A }\n{ Coated Side: Neither }\n{ Substrate Filename: N/A }\n{ Appearance: Clear }\n{ Acceptance: # }\n{ Uses:  }\n{ Availability:   }\n{ Structure:  }\n0.300    0.0020    0.0470    0.0480\n0.305    0.0030    0.0470    0.0480\n0.310    0.0090    0.0470    0.0480\n0.315    0.0350    0.0470    0.0480\n0.320    0.1000    0.0470    0.0480\n0.325    0.2180    0.0490    0.0500"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::ofstream::ofstream(local_248,"InputFile1.dat",0x10);
  std::operator<<(local_248,local_30);
  std::ofstream::close();
  std::ofstream::~ofstream(local_248);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SetUp() override
	{
		std::string inputContent = "{ Units, Wavelength Units } SI Microns\n"
			"{ Thickness } 3.048 \n"
			"{ Conductivity } 1\n"
			"{ IR Transmittance } TIR=0\n"
			"{ Emissivity, front back } Emis= 0.84 0.84\n"
			"{ }\n"
			"{ Ef_Source: Material }\n"
			"{ Eb_Source: Material }\n"
			"{ IGDB_Checksum: -1717699038 }\n"
			"{ Product Name: Generic Clear Glass }\n"
			"{ Manufacturer: Generic }\n"
			"{ NFRC ID: 102 }\n"
			"{ Type: Monolithic }\n"
			"{ Material: Glass }\n"
			"{ Coating Name: N/A }\n"
			"{ Coated Side: Neither }\n"
			"{ Substrate Filename: N/A }\n"
			"{ Appearance: Clear }\n"
			"{ Acceptance: # }\n"
			"{ Uses:  }\n"
			"{ Availability:   }\n"
			"{ Structure:  }\n"
			"0.300    0.0020    0.0470    0.0480\n"
			"0.305    0.0030    0.0470    0.0480\n"
			"0.310    0.0090    0.0470    0.0480\n"
			"0.315    0.0350    0.0470    0.0480\n"
			"0.320    0.1000    0.0470    0.0480\n"
			"0.325    0.2180    0.0490    0.0500";

		std::ofstream out("InputFile1.dat");
		out << inputContent;
		out.close();
	}